

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_buffer.hh
# Opt level: O1

bool __thiscall
dtc::input_buffer::consume_char_literal(input_buffer *this,unsigned_long_long *outInt)

{
  int iVar1;
  uint uVar2;
  byte bVar3;
  unsigned_long_long uVar4;
  uint uVar5;
  
  iVar1 = this->size;
  uVar2 = this->cursor;
  if ((int)uVar2 < 0 || iVar1 <= (int)uVar2) {
    bVar3 = 0;
  }
  else {
    bVar3 = this->buffer[uVar2];
  }
  *outInt = (ulong)bVar3;
  uVar5 = uVar2 + 1;
  this->cursor = uVar5;
  if (bVar3 != 0x5c) {
    return true;
  }
  if (iVar1 <= (int)uVar5) {
    return false;
  }
  if ((int)uVar2 < -1) {
    bVar3 = 0;
  }
  else {
    bVar3 = this->buffer[uVar5];
  }
  *outInt = (ulong)bVar3;
  this->cursor = uVar2 + 2;
  if (bVar3 < 0x6e) {
    if (bVar3 == 0x27) {
      return true;
    }
    if (bVar3 != 0x30) {
      if (bVar3 == 0x5c) {
        return true;
      }
      return false;
    }
    uVar4 = 0;
  }
  else if (bVar3 == 0x6e) {
    uVar4 = 10;
  }
  else if (bVar3 == 0x74) {
    uVar4 = 9;
  }
  else {
    if (bVar3 != 0x72) {
      return false;
    }
    uVar4 = 0xd;
  }
  *outInt = uVar4;
  return true;
}

Assistant:

inline char operator[](int offset)
	{
		if (cursor + offset >= size) { return '\0'; }
		if (cursor + offset < 0) { return '\0'; }
		return buffer[cursor + offset];
	}